

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

int ptyfd_compare(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*bv <= *av) {
    uVar1 = (uint)(*bv < *av);
  }
  return uVar1;
}

Assistant:

static int ptyfd_compare(void *av, void *bv)
{
    PtyFd *a = (PtyFd *)av;
    PtyFd *b = (PtyFd *)bv;

    if (a->fd < b->fd)
        return -1;
    else if (a->fd > b->fd)
        return +1;
    return 0;
}